

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O1

bool __thiscall BamTools::MergeTool::MergeToolPrivate::Run(MergeToolPrivate *this)

{
  MergeSettings *pMVar1;
  size_t __n;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  istream *piVar7;
  ostream *poVar8;
  BamMultiReader reader;
  BamWriter writer;
  string mergedHeader;
  RefVector references;
  ifstream filelist;
  BamMultiReader BStack_298;
  BamWriter local_290;
  BamRegion local_288;
  CompressionMode local_26c;
  value_type local_268;
  RefVector local_248;
  BamAlignment local_230;
  
  pMVar1 = this->m_settings;
  if ((pMVar1->HasInput == false) && (pMVar1->HasInputFilelist == false)) {
    psVar6 = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pMVar1->InputFiles,psVar6);
  }
  if (this->m_settings->HasInputFilelist == true) {
    std::ifstream::ifstream(&local_230,(this->m_settings->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bamtools merge ERROR: could not open input BAM file list... Aborting.",0x45);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      local_268._M_string_length = 0;
      local_268.field_2._M_local_buf[0] = '\0';
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_230.Name._M_dataplus._M_p._4_4_,
                                                 local_230.Name._M_dataplus._M_p._0_4_) + -0x18) +
                                (char)&local_230);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_230,(string *)&local_268,cVar3);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&local_268);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
    }
    std::ifstream::~ifstream(&local_230);
    if (cVar2 == '\0') {
      return false;
    }
  }
  BamMultiReader::BamMultiReader(&BStack_298);
  bVar4 = BamMultiReader::Open(&BStack_298,&this->m_settings->InputFiles);
  if (!bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "bamtools merge ERROR: could not open input BAM file(s)... Aborting.",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    bVar4 = false;
    goto LAB_00126b59;
  }
  BamMultiReader::GetHeaderText_abi_cxx11_(&local_268,&BStack_298);
  BamMultiReader::GetReferenceData(&local_248,&BStack_298);
  pMVar1 = this->m_settings;
  psVar6 = Options::StandardOut_abi_cxx11_();
  __n = (pMVar1->OutputFilename)._M_string_length;
  local_26c = Compressed;
  if ((__n == psVar6->_M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp((pMVar1->OutputFilename)._M_dataplus._M_p,(psVar6->_M_dataplus)._M_p,__n),
      local_26c = Compressed, iVar5 == 0)))) {
    local_26c = this->m_settings->IsForceCompression ^ Uncompressed;
  }
  BamWriter::BamWriter(&local_290);
  BamWriter::SetCompressionMode(&local_290,&local_26c);
  bVar4 = BamWriter::Open(&local_290,&this->m_settings->OutputFilename,&local_268,&local_248);
  if (bVar4) {
    if (this->m_settings->HasRegion == false) {
      BamAlignment::BamAlignment(&local_230);
      while (bVar4 = BamMultiReader::GetNextAlignmentCore(&BStack_298,&local_230), bVar4) {
        BamWriter::SaveAlignment(&local_290,&local_230);
      }
    }
    else {
      local_288.LeftRefID = -1;
      local_288.LeftPosition = -1;
      local_288.RightRefID = -1;
      local_288.RightPosition = -1;
      bVar4 = Utilities::ParseRegionString(&this->m_settings->Region,&BStack_298,&local_288);
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bamtools merge ERROR: could not parse REGION - ",0x2f);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->m_settings->Region)._M_dataplus._M_p,
                            (this->m_settings->Region)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                   ,0x5b);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        BamMultiReader::Close(&BStack_298);
        BamWriter::Close(&local_290);
        goto LAB_001269be;
      }
      local_230.Name._M_dataplus._M_p._0_4_ = 1;
      BamMultiReader::LocateIndexes(&BStack_298,(IndexType *)&local_230);
      bVar4 = BamMultiReader::HasIndexes(&BStack_298);
      if (bVar4) {
        bVar4 = BamMultiReader::SetRegion
                          (&BStack_298,&local_288.LeftRefID,&local_288.LeftPosition,
                           &local_288.RightRefID,&local_288.RightPosition);
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "bamtools merge ERROR: set region failed. Check that REGION describes a valid range"
                     ,0x52);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          BamMultiReader::Close(&BStack_298);
          goto LAB_001269be;
        }
        BamAlignment::BamAlignment(&local_230);
        while (bVar4 = BamMultiReader::GetNextAlignmentCore(&BStack_298,&local_230), bVar4) {
          BamWriter::SaveAlignment(&local_290,&local_230);
        }
      }
      else {
        BamAlignment::BamAlignment(&local_230);
        while (bVar4 = BamMultiReader::GetNextAlignmentCore(&BStack_298,&local_230), bVar4) {
          if ((((local_288.LeftRefID <= local_230.RefID) &&
               (local_288.LeftPosition <= local_230.Length + local_230.Position)) &&
              (local_230.RefID <= local_288.RightRefID)) &&
             (local_230.Position <= local_288.RightPosition)) {
            BamWriter::SaveAlignment(&local_290,&local_230);
          }
        }
      }
    }
    BamAlignment::~BamAlignment(&local_230);
    BamMultiReader::Close(&BStack_298);
    bVar4 = true;
    BamWriter::Close(&local_290);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bamtools merge ERROR: could not open ",0x25);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->m_settings->OutputFilename)._M_dataplus._M_p,
                        (this->m_settings->OutputFilename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," for writing.",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    BamMultiReader::Close(&BStack_298);
LAB_001269be:
    bVar4 = false;
  }
  BamWriter::~BamWriter(&local_290);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
LAB_00126b59:
  BamMultiReader::~BamMultiReader(&BStack_298);
  return bVar4;
}

Assistant:

bool MergeTool::MergeToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist) {
        m_settings->InputFiles.push_back(Options::StandardIn());
    }

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools merge ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line)) {
            m_settings->InputFiles.push_back(line);
        }
    }

    // opens the BAM files (by default without checking for indexes)
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools merge ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // retrieve header & reference dictionary info
    std::string mergedHeader = reader.GetHeaderText();
    RefVector references = reader.GetReferenceData();

    // determine compression mode for BamWriter
    bool writeUncompressed =
        (m_settings->OutputFilename == Options::StandardOut() && !m_settings->IsForceCompression);
    BamWriter::CompressionMode compressionMode = BamWriter::Compressed;
    if (writeUncompressed) {
        compressionMode = BamWriter::Uncompressed;
    }

    // open BamWriter
    BamWriter writer;
    writer.SetCompressionMode(compressionMode);
    if (!writer.Open(m_settings->OutputFilename, mergedHeader, references)) {
        std::cerr << "bamtools merge ERROR: could not open " << m_settings->OutputFilename
                  << " for writing." << std::endl;
        reader.Close();
        return false;
    }

    // if no region specified, store entire contents of file(s)
    if (!m_settings->HasRegion) {
        BamAlignment al;
        while (reader.GetNextAlignmentCore(al)) {
            writer.SaveAlignment(al);
        }
    }

    // otherwise attempt to use region as constraint
    else {

        // if region string parses OK
        BamRegion region;
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            // attempt to find index files
            reader.LocateIndexes();

            // if index data available for all BAM files, we can use SetRegion
            if (reader.HasIndexes()) {

                // attempt to use SetRegion(), if failed report error
                if (!reader.SetRegion(region.LeftRefID, region.LeftPosition, region.RightRefID,
                                      region.RightPosition)) {
                    std::cerr << "bamtools merge ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }

                // everything checks out, just iterate through specified region, storing alignments
                BamAlignment al;
                while (reader.GetNextAlignmentCore(al)) {
                    writer.SaveAlignment(al);
                }
            }

            // no index data available, we have to iterate through until we
            // find overlapping alignments
            else {
                BamAlignment al;
                while (reader.GetNextAlignmentCore(al)) {
                    if ((al.RefID >= region.LeftRefID) &&
                        ((al.Position + al.Length) >= region.LeftPosition) &&
                        (al.RefID <= region.RightRefID) && (al.Position <= region.RightPosition)) {
                        writer.SaveAlignment(al);
                    }
                }
            }
        }

        // error parsing REGION string
        else {
            std::cerr << "bamtools merge ERROR: could not parse REGION - " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            writer.Close();
            return false;
        }
    }

    // clean & exit
    reader.Close();
    writer.Close();
    return true;
}